

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3phseg_io.c
# Opt level: O0

int s3lattice_read(char *fn,s3lattice_t **lattice)

{
  int iVar1;
  uint *puVar2;
  char *pcVar3;
  void *pvVar4;
  uint local_458;
  uint32 n;
  uint32 j;
  uint32 i;
  s3lattice_t *out_lattice;
  char temp [16];
  char line [1024];
  undefined1 local_2c [4];
  FILE *pFStack_28;
  uint32 id;
  FILE *fp;
  s3lattice_t **lattice_local;
  char *fn_local;
  
  fp = (FILE *)lattice;
  lattice_local = (s3lattice_t **)fn;
  pFStack_28 = fopen(fn,"r");
  if (pFStack_28 == (FILE *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
            ,0xb7,"Failed to open lattice file %s\n",lattice_local);
  }
  else {
    puVar2 = (uint *)__ckd_calloc__(1,0x20,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
                                    ,0xbb);
    fgets(temp + 8,0x400,pFStack_28);
    pcVar3 = strstr(temp + 8,"Total arcs");
    if (pcVar3 == (char *)0x0) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
              ,0xc1,"Lattice Format Error, missing Total arcs\n");
    }
    else {
      fgets(temp + 8,0x400,pFStack_28);
      iVar1 = __isoc99_sscanf(temp + 8,"%d",puVar2);
      if (iVar1 == 1) {
        if (*puVar2 == 0) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
                  ,0xcb,"No arc exits in the lattice\n");
        }
        else {
          fgets(temp + 8,0x400,pFStack_28);
          pcVar3 = strstr(temp + 8,"True arcs");
          if (pcVar3 == (char *)0x0) {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
                    ,0xd2,"Lattice Format Error, missing True arcs\n");
          }
          else {
            fgets(temp + 8,0x400,pFStack_28);
            iVar1 = __isoc99_sscanf(temp + 8,"%d",puVar2 + 1);
            if (iVar1 == 1) {
              if (puVar2[1] == 0) {
                err_msg(ERR_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
                        ,0xdc,"No arc from the numerator lattice\n");
              }
              else if (*puVar2 < puVar2[1]) {
                err_msg(ERR_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
                        ,0xe0,
                        "The number of arcs from numerator lattice is larger than the number of total arcs\n"
                       );
              }
              else {
                fgets(temp + 8,0x400,pFStack_28);
                pcVar3 = strstr(temp + 8,"arc_id");
                if (pcVar3 == (char *)0x0) {
                  err_msg(ERR_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
                          ,0xe7,"Lattice Format Error\n");
                }
                else {
                  pvVar4 = __ckd_calloc__((ulong)*puVar2,0xd8,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
                                          ,0xec);
                  *(void **)(puVar2 + 6) = pvVar4;
                  n = 0;
                  while( true ) {
                    iVar1 = __isoc99_fscanf(pFStack_28,"%d",local_2c);
                    if (iVar1 == -1) {
                      fclose(pFStack_28);
                      *(uint **)fp = puVar2;
                      return 0;
                    }
                    __isoc99_fscanf(pFStack_28,"%s",*(long *)(puVar2 + 6) + (ulong)n * 0xd8);
                    __isoc99_fscanf(pFStack_28,"%d",*(long *)(puVar2 + 6) + (ulong)n * 0xd8 + 0x80);
                    __isoc99_fscanf(pFStack_28,"%d",*(long *)(puVar2 + 6) + (ulong)n * 0xd8 + 0x84);
                    __isoc99_fscanf(pFStack_28,"%lf",*(long *)(puVar2 + 6) + (ulong)n * 0xd8 + 0x90)
                    ;
                    __isoc99_fscanf(pFStack_28,"%d",*(long *)(puVar2 + 6) + (ulong)n * 0xd8 + 0x88);
                    __isoc99_fscanf(pFStack_28,"%d",*(long *)(puVar2 + 6) + (ulong)n * 0xd8 + 0x8c);
                    __isoc99_fscanf(pFStack_28,"%s",&out_lattice);
                    if (*(int *)(*(long *)(puVar2 + 6) + (ulong)n * 0xd8 + 0x88) == 0) break;
                    pvVar4 = __ckd_calloc__((ulong)*(uint *)(*(long *)(puVar2 + 6) + (ulong)n * 0xd8
                                                            + 0x88),4,
                                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
                                            ,0xfe);
                    *(void **)(*(long *)(puVar2 + 6) + (ulong)n * 0xd8 + 0xc0) = pvVar4;
                    for (local_458 = 0;
                        local_458 < *(uint *)(*(long *)(puVar2 + 6) + (ulong)n * 0xd8 + 0x88);
                        local_458 = local_458 + 1) {
                      __isoc99_fscanf(pFStack_28,"%d",
                                      *(long *)(*(long *)(puVar2 + 6) + (ulong)n * 0xd8 + 0xc0) +
                                      (ulong)local_458 * 4);
                    }
                    __isoc99_fscanf(pFStack_28,"%s",&out_lattice);
                    if (*(int *)(*(long *)(puVar2 + 6) + (ulong)n * 0xd8 + 0x8c) == 0) {
                      err_msg(ERR_ERROR,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
                              ,0x105,"No succeeding arc exits\n");
                      goto LAB_001173df;
                    }
                    pvVar4 = __ckd_calloc__((ulong)*(uint *)(*(long *)(puVar2 + 6) + (ulong)n * 0xd8
                                                            + 0x8c),4,
                                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
                                            ,0x108);
                    *(void **)(*(long *)(puVar2 + 6) + (ulong)n * 0xd8 + 200) = pvVar4;
                    for (local_458 = 0;
                        local_458 < *(uint *)(*(long *)(puVar2 + 6) + (ulong)n * 0xd8 + 0x8c);
                        local_458 = local_458 + 1) {
                      __isoc99_fscanf(pFStack_28,"%d",
                                      *(long *)(*(long *)(puVar2 + 6) + (ulong)n * 0xd8 + 200) +
                                      (ulong)local_458 * 4);
                    }
                    n = n + 1;
                  }
                  err_msg(ERR_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
                          ,0xfb,"No preceding arc exits\n");
                }
              }
            }
            else {
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
                      ,0xd8,"Lattice Format Error, missing True arcs\n");
            }
          }
        }
      }
      else {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
                ,199,"Lattice Format Error, missing Total arcs\n");
      }
    }
LAB_001173df:
    fclose(pFStack_28);
  }
  return -1;
}

Assistant:

int
s3lattice_read(const char *fn,
	       s3lattice_t **lattice)
{
  FILE *fp;
  uint32 id;
  char line[1024], temp[16];
  s3lattice_t *out_lattice;
  uint32 i, j, n;
  
  if ((fp = fopen(fn, "r")) == NULL) {
    E_ERROR("Failed to open lattice file %s\n", fn);
    return S3_ERROR;
  }
  
  out_lattice = ckd_calloc(1, sizeof(*out_lattice));
  
  /* process file head */
  /* read the number of total arcs */
  fgets(line, sizeof(line), fp);
  if (strstr(line, "Total arcs") == NULL) {
    E_ERROR("Lattice Format Error, missing Total arcs\n");
    goto error_out;
  }
  fgets(line, sizeof(line), fp);
  n = sscanf(line, "%d", &out_lattice->n_arcs);
  if (n!=1) {
    E_ERROR("Lattice Format Error, missing Total arcs\n");
    goto error_out;
  }
  if (out_lattice->n_arcs == 0) {
    E_ERROR("No arc exits in the lattice\n");
    goto error_out;
  }

  /* read the number of true arcs */
  fgets(line, sizeof(line), fp);
  if (strstr(line, "True arcs") == NULL) {
    E_ERROR("Lattice Format Error, missing True arcs\n");
    goto error_out;
  }
  fgets(line, sizeof(line), fp);
  n = sscanf(line, "%d", &out_lattice->n_true_arcs);
  if (n!=1) {
    E_ERROR("Lattice Format Error, missing True arcs\n");
    goto error_out;
  }
  if (out_lattice->n_true_arcs == 0) {
    E_ERROR("No arc from the numerator lattice\n");
    goto error_out;
  }
  if (out_lattice->n_true_arcs > out_lattice->n_arcs) {
    E_ERROR("The number of arcs from numerator lattice is larger than the number of total arcs\n");
    goto error_out;
  }

  /* read parameter lists */
  fgets(line, sizeof(line), fp);
  if (strstr(line, "arc_id") == NULL) {
    E_ERROR("Lattice Format Error\n");
    goto error_out;
  }
  
  /* allocate memory for arcs */
  out_lattice->arc = ckd_calloc(out_lattice->n_arcs, sizeof(*out_lattice->arc));
  
  i = 0;
  /* Get each arc */
  while (fscanf(fp, "%d", &id) != EOF) {/* arc id */
    fscanf(fp, "%s", out_lattice->arc[i].word);/* word */
    fscanf(fp, "%d", &out_lattice->arc[i].sf);/* start frame */
    fscanf(fp, "%d", &out_lattice->arc[i].ef);/* end frame */
    fscanf(fp, "%lf", &out_lattice->arc[i].lm_score);/* LM score */
    fscanf(fp, "%d", &out_lattice->arc[i].n_prev_arcs);/* num of previous arcs */
    fscanf(fp, "%d", &out_lattice->arc[i].n_next_arcs);/* num of succeeding arcs */
    
    /* read preceding arc ids */
    fscanf(fp, "%s", temp);/* move over '<' */
    if (out_lattice->arc[i].n_prev_arcs == 0) {
      E_ERROR("No preceding arc exits\n");
      goto error_out;
    }
    out_lattice->arc[i].prev_arcs = ckd_calloc(out_lattice->arc[i].n_prev_arcs, sizeof(int));
    for (j=0; j<out_lattice->arc[i].n_prev_arcs; j++)
      fscanf(fp, "%d", &out_lattice->arc[i].prev_arcs[j]);
    
    /* read succeeding arc ids */
    fscanf(fp, "%s", temp);/* move over '<' */
    if (out_lattice->arc[i].n_next_arcs == 0) {
      E_ERROR("No succeeding arc exits\n");
      goto error_out;
    }
    out_lattice->arc[i].next_arcs = ckd_calloc(out_lattice->arc[i].n_next_arcs, sizeof(int));
    for (j=0; j<out_lattice->arc[i].n_next_arcs; j++)
      fscanf(fp, "%d", &out_lattice->arc[i].next_arcs[j]);
    
    i++;
  }
  fclose(fp);
  
  *lattice = out_lattice;
  
  return S3_SUCCESS;
 error_out:
  fclose(fp);
  return S3_ERROR;
}